

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O1

CNscPStackEntry * NscBuildObjectConstant(int nOID)

{
  CNscPStackEntry *this;
  
  this = CNscContext::GetPStackEntryInt(g_pCtx);
  if (this->m_nType == NscType_Unknown) {
    this->m_nType = NscType_Object;
    CNscPStackEntry::PushConstantObject(this,nOID);
    return this;
  }
  __assert_fail("m_nType == NscType_Unknown",
                "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                ,0xee,"void CNscPStackEntry::SetType(NscType)");
}

Assistant:

YYSTYPE NscBuildObjectConstant (int nOID)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);
	pOut ->SetType (NscType_Object);
	pOut ->PushConstantObject ((UINT32) nOID);
	return pOut;
}